

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.h
# Opt level: O0

bool __thiscall Image::writeBmp(Image *this,char *fileName)

{
  FILE *__s;
  FILE *f;
  BmpHeader bmp;
  char *fileName_local;
  Image *this_local;
  
  bmp._48_8_ = fileName;
  BmpHeader::init((BmpHeader *)&f,(EVP_PKEY_CTX *)(ulong)(uint)this->_width);
  __s = fopen((char *)bmp._48_8_,"wb");
  if (__s != (FILE *)0x0) {
    fwrite((void *)((long)&f + 2),0x36,1,__s);
    fwrite(this->_data,this->_stride * (long)this->_height,1,__s);
    fclose(__s);
  }
  return __s != (FILE *)0x0;
}

Assistant:

bool writeBmp(const char* fileName) const noexcept {
    BmpHeader bmp;
    bmp.init(_width, _height);

    std::FILE* f = std::fopen(fileName, "wb");
    if (!f)
      return false;

    std::fwrite(&bmp.signature, sizeof(BmpHeader) - 2, 1, f);
    std::fwrite(_data, _stride * _height, 1, f);
    std::fclose(f);
    return true;
  }